

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcCube.c
# Opt level: O2

void Mvc_CubeBitRemoveDcs(Mvc_Cube_t *pCube)

{
  uint uVar1;
  uint uVar2;
  
  for (uVar2 = *(uint *)&pCube->field_0x8 & 0xffffff; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
    uVar1 = pCube->pData[uVar2];
    pCube->pData[uVar2] = ((uVar1 >> 1 ^ uVar1) & 0x55555555) * 3 & uVar1;
  }
  return;
}

Assistant:

void Mvc_CubeBitRemoveDcs( Mvc_Cube_t * pCube )
{
    unsigned Mask;
    int i;
    for ( i = Mvc_CubeReadLast(pCube); i >= 0; i-- )
    {
        // detect those variables that are different (not DCs)
        Mask = (pCube->pData[i] ^ (pCube->pData[i] >> 1)) & BITS_DISJOINT; 
        // create the mask of all that are different
        Mask |= (Mask << 1);
        // remove other bits from the set
        pCube->pData[i] &= Mask;
    }
}